

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O2

void __thiscall
duckdb::BuiltinFunctions::AddFunction
          (BuiltinFunctions *this,string *name,PragmaFunctionSet *functions)

{
  CreatePragmaFunctionInfo info;
  string local_230;
  FunctionSet<duckdb::PragmaFunction> local_210;
  CreatePragmaFunctionInfo local_1d8;
  
  ::std::__cxx11::string::string((string *)&local_230,(string *)name);
  FunctionSet<duckdb::PragmaFunction>::FunctionSet
            (&local_210,&functions->super_FunctionSet<duckdb::PragmaFunction>);
  CreatePragmaFunctionInfo::CreatePragmaFunctionInfo
            (&local_1d8,&local_230,(PragmaFunctionSet *)&local_210);
  FunctionSet<duckdb::PragmaFunction>::~FunctionSet(&local_210);
  ::std::__cxx11::string::~string((string *)&local_230);
  local_1d8.super_CreateFunctionInfo.super_CreateInfo.internal = true;
  Catalog::CreatePragmaFunction(this->catalog,this->transaction,&local_1d8);
  CreatePragmaFunctionInfo::~CreatePragmaFunctionInfo(&local_1d8);
  return;
}

Assistant:

void BuiltinFunctions::AddFunction(const string &name, PragmaFunctionSet functions) {
	CreatePragmaFunctionInfo info(name, std::move(functions));
	info.internal = true;
	catalog.CreatePragmaFunction(transaction, info);
}